

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

void __thiscall
ON_SimpleArray<const_ON_Geometry_*>::Append
          (ON_SimpleArray<const_ON_Geometry_*> *this,ON_Geometry **x)

{
  ON_Geometry *pOVar1;
  int iVar2;
  ON_Geometry **ppOVar3;
  long lVar4;
  
  iVar2 = *(int *)(this + 0x10);
  ppOVar3 = x;
  if (iVar2 == *(int *)(this + 0x14)) {
    iVar2 = NewCapacity(this);
    if ((*(ON_Geometry ***)(this + 8) <= x) &&
       (x < *(ON_Geometry ***)(this + 8) + *(int *)(this + 0x14))) {
      ppOVar3 = (ON_Geometry **)onmalloc(8);
      *ppOVar3 = *x;
    }
    Reserve(this,(long)iVar2);
    lVar4 = *(long *)(this + 8);
    if (lVar4 == 0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
    iVar2 = *(int *)(this + 0x10);
  }
  else {
    lVar4 = *(long *)(this + 8);
  }
  pOVar1 = *ppOVar3;
  *(int *)(this + 0x10) = iVar2 + 1;
  *(ON_Geometry **)(lVar4 + (long)iVar2 * 8) = pOVar1;
  if (ppOVar3 != x) {
    onfree(ppOVar3);
    return;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}